

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O1

void free_thread_pool(thread_pool *thread_pool)

{
  cnd_t *pcVar1;
  mtx_t *pmVar2;
  size_t sVar3;
  size_t sVar4;
  
  pmVar2 = &(thread_pool->queue).mutex;
  mtx_lock(pmVar2);
  thread_pool->should_stop = true;
  pcVar1 = &(thread_pool->queue).avail_cond;
  cnd_broadcast(pcVar1);
  mtx_unlock(pmVar2);
  sVar3 = thread_pool->thread_count;
  if (sVar3 != 0) {
    sVar4 = 0;
    do {
      thrd_join(thread_pool->threads[sVar4],0);
      sVar4 = sVar4 + 1;
    } while (sVar3 != sVar4);
  }
  mtx_destroy(pmVar2);
  cnd_destroy(pcVar1);
  cnd_destroy(&(thread_pool->queue).done_cond);
  free(thread_pool->threads);
  free(thread_pool->thread_data);
  free(thread_pool);
  return;
}

Assistant:

void free_thread_pool(struct thread_pool* thread_pool) {
    terminate_threads(thread_pool);
    free_work_queue(&thread_pool->queue);
    free(thread_pool->threads);
    free(thread_pool->thread_data);
    free(thread_pool);
}